

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O1

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  handle hVar1;
  handle hVar2;
  int iVar3;
  object *poVar4;
  long *plVar5;
  size_t sVar6;
  void *__dest;
  internals *piVar7;
  long lVar8;
  PyObject **ppPVar9;
  PyObject *pPVar10;
  PyTypeObject *pPVar11;
  error_already_set *this;
  PyObject *pPVar12;
  key_type **pppcVar13;
  size_type *psVar14;
  object *object;
  PyTypeObject *type;
  tuple bases;
  object module;
  object ht_qualname;
  object name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> full_name;
  handle local_180;
  handle local_178;
  allocator local_169;
  handle local_168;
  handle local_160;
  object local_158;
  accessor<pybind11::detail::accessor_policies::str_attr> local_150;
  handle local_130;
  long local_128;
  PyObject local_120;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  accessor<pybind11::detail::accessor_policies::tuple_item> local_50;
  
  local_168.m_ptr = (PyObject *)PyUnicode_FromString(rec->name);
  if (local_168.m_ptr != (PyObject *)0x0) {
    (local_168.m_ptr)->ob_refcnt = (local_168.m_ptr)->ob_refcnt + 1;
  }
  pPVar12 = (rec->scope).m_ptr;
  local_160.m_ptr = local_168.m_ptr;
  if (pPVar12 != (PyObject *)0x0) {
    iVar3 = PyObject_HasAttrString(pPVar12,"__qualname__");
    if (iVar3 == 1) {
      local_150.obj.m_ptr = (rec->scope).m_ptr;
      local_150.key = "__qualname__";
      local_150.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar4 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_150);
      local_130.m_ptr =
           (PyObject *)PyUnicode_FromFormat("%U.%U",(poVar4->super_handle).m_ptr,local_160.m_ptr);
      pybind11::object::operator=((object *)&local_168,(object *)&local_130);
      pybind11::object::~object((object *)&local_130);
      pybind11::object::~object(&local_150.cache);
    }
  }
  local_178.m_ptr = (PyObject *)0x0;
  pPVar12 = (rec->scope).m_ptr;
  if (pPVar12 != (PyObject *)0x0) {
    iVar3 = PyObject_HasAttrString(pPVar12,"__module__");
    if (iVar3 == 1) {
      local_150.obj.m_ptr = (rec->scope).m_ptr;
      local_150.key = "__module__";
      local_150.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar4 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_150);
    }
    else {
      iVar3 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar3 != 1) goto LAB_0011a796;
      local_150.obj.m_ptr = (rec->scope).m_ptr;
      local_150.key = "__name__";
      local_150.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar4 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_150);
    }
    local_130.m_ptr = (poVar4->super_handle).m_ptr;
    if (local_130.m_ptr != (PyObject *)0x0) {
      (local_130.m_ptr)->ob_refcnt = (local_130.m_ptr)->ob_refcnt + 1;
    }
    pybind11::object::operator=((object *)&local_178,(object *)&local_130);
    pybind11::object::~object((object *)&local_130);
    pybind11::object::~object(&local_150.cache);
  }
LAB_0011a796:
  hVar1.m_ptr = local_178.m_ptr;
  if (local_178.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&local_150,rec->name,(allocator *)&local_130);
  }
  else {
    str::str((str *)&local_158,(object *)&local_178);
    cast<std::__cxx11::string>(&local_b0,(pybind11 *)&local_158,object);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_130.m_ptr = &local_120;
    pPVar12 = (PyObject *)(plVar5 + 2);
    if ((PyObject *)*plVar5 == pPVar12) {
      local_120.ob_refcnt = pPVar12->ob_refcnt;
      local_120.ob_type = (PyTypeObject *)plVar5[3];
    }
    else {
      local_120.ob_refcnt = pPVar12->ob_refcnt;
      local_130.m_ptr = (PyObject *)*plVar5;
    }
    local_128 = plVar5[1];
    *plVar5 = (long)pPVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
    local_150._0_8_ = &local_150.key;
    pppcVar13 = (key_type **)(plVar5 + 2);
    if ((key_type **)*plVar5 == pppcVar13) {
      local_150.key = (key_type)*pppcVar13;
      local_150.cache.super_handle.m_ptr = (handle)plVar5[3];
    }
    else {
      local_150.key = (key_type)*pppcVar13;
      local_150._0_8_ = (key_type **)*plVar5;
    }
    local_150.obj.m_ptr = (PyObject *)plVar5[1];
    *plVar5 = (long)pppcVar13;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  if (hVar1.m_ptr != (PyObject *)0x0) {
    if (local_130.m_ptr != &local_120) {
      operator_delete(local_130.m_ptr,local_120.ob_refcnt + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pybind11::object::~object(&local_158);
  }
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (void *)0x0;
  }
  else {
    sVar6 = strlen(rec->doc);
    __dest = (void *)PyObject_Malloc(sVar6 + 1);
    memcpy(__dest,rec->doc,sVar6 + 1);
  }
  piVar7 = get_internals();
  tuple::tuple((tuple *)&local_180,&(rec->bases).super_object);
  lVar8 = PyTuple_Size(local_180.m_ptr);
  if (lVar8 == 0) {
    ppPVar9 = &piVar7->instance_base;
  }
  else {
    local_50.obj.m_ptr = local_180.m_ptr;
    local_50.key = 0;
    local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    ppPVar9 = (PyObject **)
              accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache(&local_50);
  }
  pPVar12 = *ppPVar9;
  if (lVar8 != 0) {
    pybind11::object::~object(&local_50.cache);
  }
  pPVar11 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar11 == (PyTypeObject *)0x0) {
    pPVar11 = piVar7->default_metaclass;
  }
  pPVar10 = (*pPVar11->tp_alloc)(pPVar11,0);
  hVar2.m_ptr = local_160.m_ptr;
  hVar1.m_ptr = local_168.m_ptr;
  if (pPVar10 == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&local_d0,rec->name,(allocator *)&local_f0);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_110._M_dataplus._M_p = (pointer)*plVar5;
    psVar14 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_110._M_dataplus._M_p == psVar14) {
      local_110.field_2._M_allocated_capacity = *psVar14;
      local_110.field_2._8_8_ = plVar5[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar14;
    }
    local_110._M_string_length = plVar5[1];
    *plVar5 = (long)psVar14;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pybind11_fail(&local_110);
  }
  local_160.m_ptr = (PyObject *)0x0;
  pPVar10[0x35].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
  local_168.m_ptr = (PyObject *)0x0;
  pPVar10[0x36].ob_refcnt = (Py_ssize_t)hVar1.m_ptr;
  pPVar11 = (PyTypeObject *)strdup((char *)local_150._0_8_);
  pPVar10[1].ob_type = pPVar11;
  pPVar10[0xb].ob_refcnt = (Py_ssize_t)__dest;
  if (pPVar12 != (PyObject *)0x0) {
    pPVar12->ob_refcnt = pPVar12->ob_refcnt + 1;
  }
  pPVar10[0x10].ob_refcnt = (Py_ssize_t)pPVar12;
  pPVar10[2].ob_refcnt = 0x38;
  lVar8 = PyTuple_Size(local_180.m_ptr);
  hVar1.m_ptr = local_180.m_ptr;
  if (lVar8 != 0) {
    local_180.m_ptr = (PyObject *)0x0;
    pPVar10[0x15].ob_refcnt = (Py_ssize_t)hVar1.m_ptr;
  }
  pPVar10[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  pPVar10[6].ob_refcnt = (Py_ssize_t)&pPVar10[0x1b].ob_type;
  pPVar10[6].ob_type = (PyTypeObject *)(pPVar10 + 0x2f);
  pPVar10[7].ob_refcnt = (Py_ssize_t)&pPVar10[0x2d].ob_type;
  pPVar11 = pPVar10[10].ob_type;
  pPVar10[10].ob_type = (PyTypeObject *)((ulong)pPVar11 | 0x600);
  if ((rec->field_0x58 & 2) != 0) {
    pPVar10[10].ob_type = (PyTypeObject *)((ulong)pPVar11 | 0x4600);
    pPVar10[0x12].ob_refcnt = pPVar10[2].ob_refcnt;
    pPVar10[2].ob_refcnt = pPVar10[2].ob_refcnt + 8;
    pPVar10[0xb].ob_type = (PyTypeObject *)pybind11_traverse;
    pPVar10[0xc].ob_refcnt = (Py_ssize_t)pybind11_clear;
    pPVar10[0xf].ob_type = (PyTypeObject *)enable_dynamic_attributes(_heaptypeobject*)::getset;
  }
  if ((rec->field_0x58 & 4) != 0) {
    pPVar10[10].ob_refcnt = (Py_ssize_t)(pPVar10 + 0x34);
    pPVar10[0x34].ob_refcnt = (Py_ssize_t)pybind11_getbuffer;
    pPVar10[0x34].ob_type = (PyTypeObject *)pybind11_releasebuffer;
  }
  iVar3 = PyType_Ready(pPVar10);
  if (iVar3 < 0) {
    std::__cxx11::string::string(local_70,rec->name,&local_169);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_70);
    local_f0._M_dataplus._M_p = (pointer)*plVar5;
    psVar14 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_f0._M_dataplus._M_p == psVar14) {
      local_f0.field_2._M_allocated_capacity = *psVar14;
      local_f0.field_2._8_8_ = plVar5[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar14;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar14;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    error_string_abi_cxx11_();
    std::operator+(&local_d0,&local_f0,&local_90);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_110._M_dataplus._M_p = (pointer)*plVar5;
    psVar14 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_110._M_dataplus._M_p == psVar14) {
      local_110.field_2._M_allocated_capacity = *psVar14;
      local_110.field_2._8_8_ = plVar5[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar14;
    }
    local_110._M_string_length = plVar5[1];
    *plVar5 = (long)psVar14;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pybind11_fail(&local_110);
  }
  if (((rec->field_0x58 & 2) == 0) != (((ulong)pPVar10[10].ob_type & 0x4000) == 0)) {
    __assert_fail("rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC) : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/class_support.h"
                  ,0x22e,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
  }
  pPVar12 = (rec->scope).m_ptr;
  if (pPVar12 != (PyObject *)0x0) {
    iVar3 = PyObject_SetAttrString(pPVar12,rec->name,pPVar10);
    if (iVar3 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      goto LAB_0011ac8b;
    }
  }
  if (local_178.m_ptr != (PyObject *)0x0) {
    iVar3 = PyObject_SetAttrString(pPVar10,"__module__");
    if (iVar3 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
LAB_0011ac8b:
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
  }
  pybind11::object::~object((object *)&local_180);
  if ((key_type *)local_150._0_8_ != &local_150.key) {
    operator_delete((void *)local_150._0_8_,(long)local_150.key + 1);
  }
  pybind11::object::~object((object *)&local_178);
  pybind11::object::~object((object *)&local_168);
  pybind11::object::~object((object *)&local_160);
  return pPVar10;
}

Assistant:

inline PyObject* make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    auto ht_qualname = name;
    if (rec.scope && hasattr(rec.scope, "__qualname__")) {
        ht_qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
    }
#endif

    object module;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__"))
            module = rec.scope.attr("__module__");
        else if (hasattr(rec.scope, "__name__"))
            module = rec.scope.attr("__name__");
    }

#if !defined(PYPY_VERSION)
    const auto full_name = module ? str(module).cast<std::string>() + "." + rec.name
                                  : std::string(rec.name);
#else
    const auto full_name = std::string(rec.name);
#endif

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (using PyObject_MALLOC, since
           Python will free this later on) */
        size_t size = strlen(rec.doc) + 1;
        tp_doc = (char *) PyObject_MALLOC(size);
        memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto base = (bases.size() == 0) ? internals.instance_base
                                    : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto metaclass = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr()
                                         : internals.default_metaclass;

    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");

    heap_type->ht_name = name.release().ptr();
#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    heap_type->ht_qualname = ht_qualname.release().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = strdup(full_name.c_str());
    type->tp_doc = tp_doc;
    type->tp_base = (PyTypeObject *) handle(base).inc_ref().ptr();
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (bases.size() > 0)
        type->tp_bases = bases.release().ptr();

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
    type->tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif

    if (rec.dynamic_attr)
        enable_dynamic_attributes(heap_type);

    if (rec.buffer_protocol)
        enable_buffer_protocol(heap_type);

    if (PyType_Ready(type) < 0)
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed (" + error_string() + ")!");

    assert(rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)
                            : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope)
        setattr(rec.scope, rec.name, (PyObject *) type);

    if (module) // Needed by pydoc
        setattr((PyObject *) type, "__module__", module);

    return (PyObject *) type;
}